

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex_interface.cpp
# Opt level: O1

char * SoPlex_objValueRationalString(void *soplex)

{
  char *pcVar1;
  size_t sVar2;
  char *__dest;
  string objstring;
  char *local_a8;
  undefined8 local_a0;
  char local_98;
  undefined7 uStack_97;
  data_type local_88;
  char local_73;
  char local_72;
  uint local_68;
  void *local_60;
  char local_53;
  char local_52;
  string local_40;
  
  local_a0 = 0;
  local_98 = '\0';
  local_a8 = &local_98;
  sVar2 = strlen(&local_98);
  ::soplex::SoPlexBase<double>::objValueRational
            ((Rational *)&local_88.ld,(SoPlexBase<double> *)soplex);
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
  ::str_abi_cxx11_(&local_40,
                   (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                    *)&local_88.ld,0,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
  std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((local_53 == '\0') && (local_52 == '\0')) {
    operator_delete(local_60,(ulong)local_68 << 3);
  }
  if ((local_73 == '\0') && (local_72 == '\0')) {
    operator_delete(local_88.ld.data,(ulong)local_88.ld.capacity << 3);
  }
  __dest = (char *)operator_new__(sVar2 + 1);
  pcVar1 = local_a8;
  strncpy(__dest,local_a8,sVar2 + 1);
  if (pcVar1 != &local_98) {
    operator_delete(pcVar1,CONCAT71(uStack_97,local_98) + 1);
  }
  return __dest;
}

Assistant:

char* SoPlex_objValueRationalString(void* soplex)
{
#ifndef SOPLEX_WITH_BOOST
   throw SPxException("Rational functions cannot be used when built without Boost.");
#endif
   /* coverity[unreachable] */
   long unsigned int stringlength;
   char* value;
   std::string objstring;
   SoPlex* so = (SoPlex*)(soplex);

   stringlength = strlen(objstring.c_str()) + 1;
   objstring = so->objValueRational().str();
   value = new char[stringlength];
   strncpy(value, objstring.c_str(), stringlength);
   return value;
}